

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O3

string * compareObjects(string *__return_storage_ptr__,string *label,QPDFObjectHandle *act,
                       QPDFObjectHandle *exp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  element_type *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  long lVar10;
  long lVar11;
  void *__s1;
  void *__s2;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  element_type *this_01;
  bool bVar12;
  iterator __begin3;
  iterator __end3;
  QPDFObjectHandle act_dict;
  QPDFObjectHandle exp_dict;
  iterator local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  iterator local_b8;
  string *local_90;
  string local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68 [2];
  QPDFObjectHandle *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar7 = QPDFObjectHandle::getTypeCode();
  iVar8 = QPDFObjectHandle::getTypeCode();
  if (iVar7 != iVar8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (label->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + label->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  cVar5 = QPDFObjectHandle::isStream();
  if (cVar5 == '\0') {
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    pp_Var4 = local_b8._vptr_iterator;
    if (local_f8.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr ==
        local_b8.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr) {
      if (local_f8.m.
          super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        bVar12 = false;
      }
      else {
        iVar7 = bcmp(local_f8._vptr_iterator,local_b8._vptr_iterator,
                     (size_t)local_f8.m.
                             super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        bVar12 = iVar7 != 0;
      }
    }
    else {
      bVar12 = true;
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pp_Var4 !=
        &local_b8.m.
         super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount) {
      operator_delete(pp_Var4,(ulong)(local_b8.m.
                                      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi + 1));
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator !=
        &local_f8.m.
         super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount) {
      operator_delete(local_f8._vptr_iterator,
                      (ulong)(local_f8.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
    }
    if (bVar12) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (label->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + label->_M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    goto LAB_00103bf4;
  }
  local_90 = label;
  QPDFObjectHandle::getDict();
  QPDFObjectHandle::getDict();
  p_Var1 = &local_f8.m.
            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_f8._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Length","");
  QPDFObjectHandle::removeKey(local_88);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator != p_Var1) {
    operator_delete(local_f8._vptr_iterator,
                    (ulong)(local_f8.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1));
  }
  local_f8._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Length","");
  QPDFObjectHandle::removeKey(local_40);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator != p_Var1) {
    operator_delete(local_f8._vptr_iterator,
                    (ulong)(local_f8.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  pp_Var4 = local_b8._vptr_iterator;
  local_58 = exp;
  if (local_f8.m.
      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr ==
      local_b8.m.
      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr) {
    if (local_f8.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      bVar12 = false;
    }
    else {
      iVar7 = bcmp(local_f8._vptr_iterator,local_b8._vptr_iterator,
                   (size_t)local_f8.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
      bVar12 = iVar7 != 0;
    }
  }
  else {
    bVar12 = true;
  }
  p_Var2 = &local_b8.m.
            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pp_Var4 != p_Var2) {
    operator_delete(pp_Var4,(ulong)(local_b8.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 1));
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator != p_Var1) {
    operator_delete(local_f8._vptr_iterator,
                    (ulong)(local_f8.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1));
  }
  if (bVar12) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (local_90->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + local_90->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00103bcc:
    bVar12 = false;
  }
  else {
    local_f8._vptr_iterator = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Type","");
    QPDFObjectHandle::getKey((string *)&local_78);
    local_b8._vptr_iterator = (_func_int **)p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/XRef","");
    cVar5 = QPDFObjectHandle::isNameAndEquals((string *)&local_78);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8._vptr_iterator != p_Var2) {
      operator_delete(local_b8._vptr_iterator,
                      (ulong)(local_b8.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator != p_Var1) {
      operator_delete(local_f8._vptr_iterator,
                      (ulong)(local_f8.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
    }
    if (cVar5 != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_00103bcc;
    }
    local_f8._vptr_iterator = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Filter","");
    QPDFObjectHandle::getKey((string *)&local_c8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator != p_Var1) {
      operator_delete(local_f8._vptr_iterator,
                      (ulong)(local_f8.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
    }
    cVar5 = QPDFObjectHandle::isName();
    if (cVar5 != '\0') {
      QPDFObjectHandle::wrapInArray();
      this_00 = p_Stack_c0;
      p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_f8.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
      local_c8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8._vptr_iterator;
      local_f8._vptr_iterator = (_func_int **)0x0;
      local_f8.m.
      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         local_f8.m.
         super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_f8.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
    }
    cVar5 = QPDFObjectHandle::isArray();
    if (cVar5 == '\0') {
LAB_00103daf:
      QPDFObjectHandle::getRawStreamData();
      this_01 = local_f8.m.
                super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      QPDFObjectHandle::getRawStreamData();
    }
    else {
      QPDFObjectHandle::aitems();
      QPDFObjectHandle::QPDFArrayItems::begin();
      QPDFObjectHandle::QPDFArrayItems::end();
      while (cVar5 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==(&local_f8,&local_b8),
            cVar5 == '\0') {
        psVar9 = (string *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&local_f8);
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/FlateDecode","");
        cVar6 = QPDFObjectHandle::isNameAndEquals(psVar9);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (cVar6 != '\0') break;
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&local_f8);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_b8);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_f8);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (cVar5 != '\0') goto LAB_00103daf;
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_f8);
      this_01 = local_f8.m.
                super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_f8);
    }
    this = local_f8.m.
           super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    lVar10 = Buffer::getSize();
    lVar11 = Buffer::getSize();
    if (lVar10 == lVar11) {
      __s1 = (void *)Buffer::getBuffer();
      __s2 = (void *)Buffer::getBuffer();
      __n = Buffer::getSize();
      iVar7 = bcmp(__s1,__s2,__n);
      if (iVar7 != 0) {
        std::operator+(__return_storage_ptr__,local_90,": stream data differs");
        goto LAB_00103e93;
      }
      bVar12 = true;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (local_90->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + local_90->_M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00103e93:
      bVar12 = false;
    }
    if (this != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    }
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (!bVar12) {
    return __return_storage_ptr__;
  }
LAB_00103bf4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string
compareObjects(std::string const& label, QPDFObjectHandle act, QPDFObjectHandle exp)
{
    if (act.getTypeCode() != exp.getTypeCode()) {
        QTC::TC("compare", "objects with different type");
        return label + ": different types";
    }
    if (act.isStream()) {
        // Disregard stream lengths. The length of stream data is compared later, and we don't care
        // about the length of compressed data as long as the uncompressed data matches.
        auto act_dict = act.getDict();
        auto exp_dict = exp.getDict();
        act_dict.removeKey("/Length");
        exp_dict.removeKey("/Length");
        if (act_dict.unparse() != exp_dict.unparse()) {
            QTC::TC("compare", "different stream dictionaries");
            return label + ": stream dictionaries differ";
        }
        if (act_dict.getKey("/Type").isNameAndEquals("/XRef")) {
            // Cross-reference streams will generally not match, but we have numerous tests that
            // meaningfully ensure that xref streams are correct.
            QTC::TC("compare", "ignore data for xref stream");
            return "";
        }
        auto act_filters = act_dict.getKey("/Filter");
        bool uncompress = false;
        if (act_filters.isName()) {
            act_filters = act_filters.wrapInArray();
        }
        if (act_filters.isArray()) {
            for (auto& filter: act_filters.aitems()) {
                if (filter.isNameAndEquals("/FlateDecode")) {
                    uncompress = true;
                    break;
                }
            }
        }
        std::shared_ptr<Buffer> act_data;
        std::shared_ptr<Buffer> exp_data;
        if (uncompress) {
            QTC::TC("compare", "uncompressing");
            act_data = act.getStreamData();
            exp_data = exp.getStreamData();
        } else {
            QTC::TC("compare", "not uncompressing");
            act_data = act.getRawStreamData();
            exp_data = exp.getRawStreamData();
        }
        if (act_data->getSize() != exp_data->getSize()) {
            QTC::TC("compare", "differing data size", uncompress ? 0 : 1);
            return label + ": stream data size differs";
        }
        auto act_buf = act_data->getBuffer();
        auto exp_buf = exp_data->getBuffer();
        if (memcmp(act_buf, exp_buf, act_data->getSize()) != 0) {
            QTC::TC("compare", "different data", uncompress ? 0 : 1);
            return label + ": stream data differs";
        }
    } else if (act.unparseResolved() != exp.unparseResolved()) {
        QTC::TC("compare", "different non-stream");
        return label + ": object contents differ";
    }
    return "";
}